

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kosaraju_scc.cpp
# Opt level: O0

void __thiscall KosarajuSCC::run(KosarajuSCC *this)

{
  int iVar1;
  byte bVar2;
  bool bVar3;
  KosarajuSCC *this_00;
  bool *__s;
  reference pvVar4;
  long *in_RDI;
  ulong uVar5;
  int v;
  int curr;
  int i;
  bool *visited;
  stack<int,_std::deque<int,_std::allocator<int>_>_> s;
  stack<int,_std::deque<int,_std::allocator<int>_>_> *in_stack_ffffffffffffff20;
  allocator_type *in_stack_ffffffffffffff28;
  undefined6 in_stack_ffffffffffffff30;
  undefined1 in_stack_ffffffffffffff36;
  undefined1 in_stack_ffffffffffffff37;
  size_type in_stack_ffffffffffffff38;
  stack<int,_std::deque<int,_std::allocator<int>_>_> *s_00;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffff40;
  bool *visited_00;
  int local_94;
  
  this_00 = (KosarajuSCC *)(long)(int)in_RDI[1];
  std::allocator<int>::allocator((allocator<int> *)0x2a2302);
  std::vector<int,_std::allocator<int>_>::vector
            (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,
             (value_type_conflict *)
             CONCAT17(in_stack_ffffffffffffff37,
                      CONCAT16(in_stack_ffffffffffffff36,in_stack_ffffffffffffff30)),
             in_stack_ffffffffffffff28);
  s_00 = (stack<int,_std::deque<int,_std::allocator<int>_>_> *)&stack0xffffffffffffffe0;
  std::vector<int,_std::allocator<int>_>::operator=
            ((vector<int,_std::allocator<int>_> *)
             CONCAT17(in_stack_ffffffffffffff37,
                      CONCAT16(in_stack_ffffffffffffff36,in_stack_ffffffffffffff30)),
             (vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff28);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)
             CONCAT17(in_stack_ffffffffffffff37,
                      CONCAT16(in_stack_ffffffffffffff36,in_stack_ffffffffffffff30)));
  std::allocator<int>::~allocator((allocator<int> *)0x2a2355);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::clear((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           *)0x2a2363);
  std::stack<int,std::deque<int,std::allocator<int>>>::
  stack<std::deque<int,std::allocator<int>>,void>(in_stack_ffffffffffffff20);
  uVar5 = (ulong)(int)in_RDI[1];
  if ((long)uVar5 < 0) {
    uVar5 = 0xffffffffffffffff;
  }
  __s = (bool *)operator_new__(uVar5);
  visited_00 = __s;
  memset(__s,0,(long)(int)in_RDI[1]);
  for (local_94 = 0; local_94 < (int)in_RDI[1]; local_94 = local_94 + 1) {
    if (((__s[local_94] & 1U) == 0) && (bVar2 = (**(code **)(*in_RDI + 0x18))(), (bVar2 & 1) == 0))
    {
      fillOrder(this_00,(int)((ulong)in_RDI >> 0x20),visited_00,s_00);
    }
  }
  memset(__s,0,(long)(int)in_RDI[1]);
  while (bVar3 = std::stack<int,_std::deque<int,_std::allocator<int>_>_>::empty
                           ((stack<int,_std::deque<int,_std::allocator<int>_>_> *)0x2a24ac),
        ((bVar3 ^ 0xffU) & 1) != 0) {
    pvVar4 = std::stack<int,_std::deque<int,_std::allocator<int>_>_>::top
                       ((stack<int,_std::deque<int,_std::allocator<int>_>_> *)0x2a24c8);
    iVar1 = *pvVar4;
    std::stack<int,_std::deque<int,_std::allocator<int>_>_>::pop
              ((stack<int,_std::deque<int,_std::allocator<int>_>_> *)0x2a24e4);
    if ((__s[iVar1] & 1U) == 0) {
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::emplace_back<>((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                        *)in_stack_ffffffffffffff20);
      DFS(this_00,(int)((ulong)in_RDI >> 0x20),visited_00,(int)((ulong)s_00 >> 0x20));
    }
  }
  if (__s != (bool *)0x0) {
    operator_delete__(__s);
  }
  std::stack<int,_std::deque<int,_std::allocator<int>_>_>::~stack
            ((stack<int,_std::deque<int,_std::allocator<int>_>_> *)0x2a255a);
  return;
}

Assistant:

void KosarajuSCC::run() {
	scc = std::vector<int>(nb_nodes, -1);
	sccs.clear();
	std::stack<int> s;

	// Mark all the vertices as not visited (For first DFS)
	bool* visited = new bool[nb_nodes];
	memset(visited, 0, nb_nodes * sizeof(bool));
	// Fill vertices in stack according to their finishing times
	for (int i = 0; i < nb_nodes; i++) {
		if (visited[i] == false && !ignore_node(i)) {
			fillOrder(i, visited, s);
		}
	}

	// Mark all the vertices as not visited (For second DFS)
	memset(visited, 0, nb_nodes * sizeof(bool));

	// Now process all vertices in order defined by Stack
	int curr = 0;
	while (!s.empty()) {
		// Pop a vertex from stack
		const int v = s.top();
		s.pop();

		// Print Strongly connected component of the popped vertex
		if (visited[v] == false) {
			sccs.emplace_back();
			DFS(v, visited, curr);
			curr++;
		}
	}
	delete[] visited;
}